

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_path.cpp
# Opt level: O2

DWORD GetTempPathW(DWORD nBufferLength,LPWSTR lpBuffer)

{
  undefined8 uVar1;
  long lVar2;
  DWORD DVar3;
  int iVar4;
  CHAR *pCVar5;
  CHAR *lpBuffer_00;
  long in_FS_OFFSET;
  undefined8 uStack_50;
  CHAR aCStack_48 [8];
  CHAR *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lpBuffer_00 = aCStack_48;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_003242c4;
  if (lpBuffer == (LPWSTR)0x0) {
    uStack_50 = 0x324269;
    SetLastError(0x57);
    DVar3 = 0;
    pCVar5 = aCStack_48;
    lpBuffer_00 = aCStack_48;
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_003242c4;
    goto LAB_003242a3;
  }
  lVar2 = -((ulong)(nBufferLength + (nBufferLength == 0)) + 0xf & 0xfffffffffffffff0);
  lpBuffer_00 = aCStack_48 + lVar2;
  local_40 = aCStack_48;
  *(undefined8 *)((long)&uStack_50 + lVar2) = 0x3241e3;
  DVar3 = GetTempPathA(nBufferLength,lpBuffer_00);
  if (DVar3 < nBufferLength) {
    if (DVar3 == 0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_003242c4;
      *lpBuffer = L'\0';
    }
    else {
      *(undefined8 *)((long)&uStack_50 + lVar2) = 0xffffffffffffffff;
      uVar1 = *(undefined8 *)((long)&uStack_50 + lVar2);
      *(undefined8 *)((long)&uStack_50 + lVar2) = 0x324210;
      iVar4 = MultiByteToWideChar(0,0,lpBuffer_00,(int)uVar1,lpBuffer,DVar3 + 1);
      if (iVar4 != 0) goto LAB_00324298;
      *(undefined8 *)((long)&uStack_50 + lVar2) = 0x324244;
      fprintf(_stderr,"] %s %s:%d","GetTempPathW",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
              ,0x254);
      *(undefined8 *)((long)&uStack_50 + lVar2) = 0x324255;
      fprintf(_stderr,"An error occurred while converting the string to wide.\n");
      *(undefined8 *)((long)&uStack_50 + lVar2) = 0x32425f;
      SetLastError(0x54f);
    }
    DVar3 = 0;
  }
  else {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_003242c4;
    *(undefined8 *)((long)&uStack_50 + lVar2) = 0x7a;
    uVar1 = *(undefined8 *)((long)&uStack_50 + lVar2);
    *(undefined8 *)((long)&uStack_50 + lVar2) = 0x324284;
    SetLastError((DWORD)uVar1);
    *lpBuffer = L'\0';
  }
LAB_00324298:
  pCVar5 = local_40;
  if (PAL_InitializeChakraCoreCalled != false) {
LAB_003242a3:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
      *(code **)(pCVar5 + -8) = FILEDosToUnixPathW;
      __stack_chk_fail();
    }
    return DVar3;
  }
LAB_003242c4:
  lpBuffer_00[-8] = -0x37;
  lpBuffer_00[-7] = 'B';
  lpBuffer_00[-6] = '2';
  lpBuffer_00[-5] = '\0';
  lpBuffer_00[-4] = '\0';
  lpBuffer_00[-3] = '\0';
  lpBuffer_00[-2] = '\0';
  lpBuffer_00[-1] = '\0';
  abort();
}

Assistant:

DWORD
PALAPI
GetTempPathW(
	     IN DWORD nBufferLength,
	     OUT LPWSTR lpBuffer)
{
    PERF_ENTRY(GetTempPathW);
    ENTRY("GetTempPathW(nBufferLength=%u, lpBuffer=%p)\n",
          nBufferLength, lpBuffer);

    if (!lpBuffer)
    {
        ERROR("lpBuffer was not a valid pointer.\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        LOGEXIT("GetTempPathW returns DWORD 0\n");
        PERF_EXIT(GetTempPathW);
        return 0;
    }

    char TempBuffer[nBufferLength > 0 ? nBufferLength : 1];
    DWORD dwRetVal = GetTempPathA( nBufferLength, TempBuffer );

    if ( dwRetVal >= nBufferLength )
    {
        ERROR( "lpBuffer was not large enough.\n" );
        SetLastError( ERROR_INSUFFICIENT_BUFFER );
        *lpBuffer = '\0';
    }
    else if ( dwRetVal != 0 )
    {
        /* Convert to wide. */
        if ( 0 == MultiByteToWideChar( CP_ACP, 0, TempBuffer, -1,
                                       lpBuffer, dwRetVal + 1 ) )
        {
            ASSERT( "An error occurred while converting the string to wide.\n" );
            SetLastError( ERROR_INTERNAL_ERROR );
            dwRetVal = 0;
        }
    }
    else
    {
        ERROR( "The function failed.\n" );
        *lpBuffer = '\0';
    }

    LOGEXIT("GetTempPathW returns DWORD %u\n", dwRetVal );
    PERF_EXIT(GetTempPathW);
    return dwRetVal;
}